

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlFAParseBranch(xmlRegParserCtxtPtr ctxt,xmlRegStatePtr to)

{
  xmlChar xVar1;
  xmlRegStatePtr from;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  xmlRegStatePtr pxVar4;
  
  from = ctxt->state;
  iVar2 = xmlFAParsePiece(ctxt);
  if (iVar2 == 0) {
    iVar3 = xmlFAGenerateEpsilonTransition(ctxt,from,to);
  }
  else {
    xVar1 = *ctxt->cur;
    pxVar4 = to;
    if (((xVar1 != '\0') && (xVar1 != '|')) && (xVar1 != ')')) {
      pxVar4 = (xmlRegStatePtr)0x0;
    }
    iVar3 = xmlFAGenerateTransitions(ctxt,from,pxVar4,ctxt->atom);
    if (iVar3 < 0) goto code_r0x0017fcb8;
    from = ctxt->state;
    ctxt->atom = (xmlRegAtomPtr)0x0;
  }
  while( true ) {
    do {
      if ((iVar2 == 0) || (ctxt->error != 0)) {
        return iVar3;
      }
      iVar2 = xmlFAParsePiece(ctxt);
      iVar3 = iVar2;
    } while (iVar2 == 0);
    xVar1 = *ctxt->cur;
    pxVar4 = to;
    if (((xVar1 != '\0') && (xVar1 != '|')) && (xVar1 != ')')) {
      pxVar4 = (xmlRegStatePtr)0x0;
    }
    iVar3 = xmlFAGenerateTransitions(ctxt,from,pxVar4,ctxt->atom);
    if (iVar3 < 0) break;
    from = ctxt->state;
    ctxt->atom = (xmlRegAtomPtr)0x0;
  }
code_r0x0017fcb8:
  xmlRegFreeAtom(ctxt->atom);
  ctxt->atom = (xmlRegAtomPtr)0x0;
  return extraout_EAX;
}

Assistant:

static int
xmlFAParseBranch(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr to) {
    xmlRegStatePtr previous;
    int ret;

    previous = ctxt->state;
    ret = xmlFAParsePiece(ctxt);
    if (ret == 0) {
        /* Empty branch */
	xmlFAGenerateEpsilonTransition(ctxt, previous, to);
    } else {
	if (xmlFAGenerateTransitions(ctxt, previous,
	        (CUR=='|' || CUR==')' || CUR==0) ? to : NULL,
                ctxt->atom) < 0) {
            xmlRegFreeAtom(ctxt->atom);
            ctxt->atom = NULL;
	    return(-1);
        }
	previous = ctxt->state;
	ctxt->atom = NULL;
    }
    while ((ret != 0) && (ctxt->error == 0)) {
	ret = xmlFAParsePiece(ctxt);
	if (ret != 0) {
	    if (xmlFAGenerateTransitions(ctxt, previous,
	            (CUR=='|' || CUR==')' || CUR==0) ? to : NULL,
                    ctxt->atom) < 0) {
                xmlRegFreeAtom(ctxt->atom);
                ctxt->atom = NULL;
                return(-1);
            }
	    previous = ctxt->state;
	    ctxt->atom = NULL;
	}
    }
    return(0);
}